

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

BOOL __thiscall
Js::FunctionBody::GetMatchingStatementMapFromNativeAddress
          (FunctionBody *this,DWORD_PTR codeAddress,StatementData *data,uint loopNum,
          FunctionBody *inlinee)

{
  int statementIndex_00;
  BOOL BVar1;
  FunctionEntryPointInfo *pFStack_48;
  int statementIndex;
  EntryPointInfo *entryPoint;
  DWORD_PTR nativeBaseAddress;
  SmallSpanSequence *spanSequence;
  FunctionBody *inlinee_local;
  uint loopNum_local;
  StatementData *data_local;
  DWORD_PTR codeAddress_local;
  FunctionBody *this_local;
  
  nativeBaseAddress = 0;
  entryPoint = (EntryPointInfo *)0x0;
  if (loopNum == 0xffffffff) {
    pFStack_48 = GetEntryPointFromNativeAddress(this,codeAddress);
  }
  else {
    pFStack_48 = (FunctionEntryPointInfo *)
                 GetLoopEntryPointInfoFromNativeAddress(this,codeAddress,loopNum);
  }
  if (pFStack_48 != (FunctionEntryPointInfo *)0x0) {
    nativeBaseAddress =
         (DWORD_PTR)EntryPointInfo::GetNativeThrowSpanSequence(&pFStack_48->super_EntryPointInfo);
    entryPoint = (EntryPointInfo *)
                 EntryPointInfo::GetNativeAddress(&pFStack_48->super_EntryPointInfo);
  }
  statementIndex_00 =
       GetStatementIndexFromNativeAddress
                 (this,(SmallSpanSequence *)nativeBaseAddress,codeAddress,(DWORD_PTR)entryPoint);
  BVar1 = GetMatchingStatementMap(this,data,statementIndex_00,inlinee);
  return BVar1;
}

Assistant:

BOOL FunctionBody::GetMatchingStatementMapFromNativeAddress(DWORD_PTR codeAddress, StatementData &data, uint loopNum, FunctionBody *inlinee /* = nullptr */)
    {
        SmallSpanSequence * spanSequence = nullptr;
        DWORD_PTR nativeBaseAddress = NULL;

        EntryPointInfo * entryPoint;
        if (loopNum == -1)
        {
            entryPoint = GetEntryPointFromNativeAddress(codeAddress);
        }
        else
        {
            entryPoint = GetLoopEntryPointInfoFromNativeAddress(codeAddress, loopNum);
        }

        if (entryPoint != nullptr)
        {
            spanSequence = entryPoint->GetNativeThrowSpanSequence();
            nativeBaseAddress = entryPoint->GetNativeAddress();
        }

        int statementIndex = GetStatementIndexFromNativeAddress(spanSequence, codeAddress, nativeBaseAddress);

        return GetMatchingStatementMap(data, statementIndex, inlinee);
    }